

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_SortUnsignedIntArray(sort_algorithm sort_algorithm,uint *a,size_t nel)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  uint *puVar9;
  uint *puVar10;
  ulong uVar11;
  uint *puVar12;
  uint *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (uint *)0x0) {
      uVar5 = nel >> 1;
      puVar4 = a + (nel - 1);
      uVar6 = nel - 1;
      do {
        if (uVar5 == 0) {
          uVar8 = *puVar4;
          *puVar4 = *a;
          uVar6 = uVar6 - 1;
          if (uVar6 == 0) {
            *a = uVar8;
            return;
          }
          puVar4 = puVar4 + -1;
          uVar5 = 0;
        }
        else {
          uVar8 = a[uVar5 - 1];
          uVar5 = uVar5 - 1;
        }
        puVar9 = a + uVar5;
        if (uVar5 * 2 < uVar6) {
          uVar11 = uVar5 * 2 | 1;
          do {
            puVar7 = a + uVar11;
            if (uVar11 < uVar6) {
              puVar10 = puVar7 + 1;
              uVar1 = *puVar7;
              if (uVar1 < *puVar10) {
                puVar7 = puVar7 + 1;
              }
              uVar11 = uVar11 + (uVar1 < *puVar10);
            }
            uVar2 = uVar6;
            if (uVar8 < *puVar7) {
              *puVar9 = *puVar7;
              puVar9 = puVar7;
              uVar2 = uVar11 * 2;
            }
            uVar11 = uVar2 + 1;
          } while (uVar11 <= uVar6);
        }
        *puVar9 = uVar8;
      } while( true );
    }
  }
  else if (1 < nel && a != (uint *)0x0) {
    uVar5 = 0;
    puVar4 = a + (nel - 1);
LAB_005bbd8e:
    while( true ) {
      iVar3 = (int)uVar5;
      uVar6 = ((long)puVar4 - (long)a >> 2) + 1;
      if (uVar6 < 9) break;
      puVar9 = (uint *)((long)a + (uVar6 & 0xfffffffffffffffe) * 2);
      uVar8 = *a;
      if (*puVar9 < uVar8) {
        *a = *puVar9;
        *puVar9 = uVar8;
      }
      uVar8 = *a;
      if (*puVar4 < uVar8) {
        *a = *puVar4;
        *puVar4 = uVar8;
      }
      uVar8 = *puVar9;
      puVar7 = a;
      puVar10 = puVar4;
      if (*puVar4 < uVar8) {
        *puVar9 = *puVar4;
        *puVar4 = uVar8;
      }
LAB_005bbde0:
      if (puVar7 < puVar9) {
        do {
          puVar7 = puVar7 + 1;
          if (puVar9 <= puVar7) break;
        } while (*puVar7 <= *puVar9);
      }
      if (puVar9 <= puVar7) {
        do {
          puVar7 = puVar7 + 1;
          if (puVar4 < puVar7) break;
        } while (*puVar7 <= *puVar9);
      }
      do {
        puVar12 = puVar10;
        puVar10 = puVar12 + -1;
        if (puVar10 <= puVar9) break;
      } while (*puVar9 < *puVar10);
      if (puVar7 <= puVar10) {
        uVar8 = *puVar7;
        *puVar7 = *puVar10;
        *puVar10 = uVar8;
        if (puVar10 == puVar9) {
          puVar9 = puVar7;
        }
        goto LAB_005bbde0;
      }
      if (puVar9 < puVar12) {
        do {
          puVar12 = puVar10;
          if (puVar12 <= puVar9) break;
          puVar10 = puVar12 + -1;
        } while (*puVar12 == *puVar9);
      }
      if (puVar12 <= puVar9) {
        do {
          puVar12 = puVar12 + -1;
          if (puVar12 <= a) break;
        } while (*puVar12 == *puVar9);
      }
      if ((long)puVar12 - (long)a < (long)puVar4 - (long)puVar7) goto LAB_005bbf0e;
      if (a < puVar12) {
        auStack_208[iVar3] = a;
        auStack_3f8[iVar3] = puVar12;
        uVar5 = (ulong)(iVar3 + 1);
      }
      iVar3 = (int)uVar5;
      a = puVar7;
      if (puVar4 <= puVar7) goto LAB_005bbf31;
    }
    for (; puVar7 = a, puVar9 = a, a < puVar4; puVar4 = puVar4 + -1) {
      while (puVar10 = puVar7, puVar9 = puVar9 + 1, puVar9 <= puVar4) {
        puVar7 = puVar9;
        if (*puVar9 <= *puVar10) {
          puVar7 = puVar10;
        }
      }
      uVar8 = *puVar10;
      *puVar10 = *puVar4;
      *puVar4 = uVar8;
    }
    goto LAB_005bbf31;
  }
  return;
LAB_005bbf0e:
  if (puVar7 < puVar4) {
    auStack_208[iVar3] = puVar7;
    auStack_3f8[iVar3] = puVar4;
    uVar5 = (ulong)(iVar3 + 1);
  }
  iVar3 = (int)uVar5;
  puVar4 = puVar12;
  if (puVar12 <= a) {
LAB_005bbf31:
    if (iVar3 < 1) {
      return;
    }
    uVar5 = (ulong)(iVar3 - 1);
    a = (uint *)auStack_208[uVar5];
    puVar4 = (uint *)auStack_3f8[uVar5];
  }
  goto LAB_005bbd8e;
}

Assistant:

void ON_SortUnsignedIntArray(
        ON::sort_algorithm sort_algorithm,
        unsigned int* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint(a,nel);
  else
    ON_qsort_uint(a,nel);
}